

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

ON_SHA1_Hash * __thiscall
ON_SubD::EdgeHash(ON_SHA1_Hash *__return_storage_ptr__,ON_SubD *this,ON_SubDHashType hash_type)

{
  element_type *peVar1;
  ON_SubDLevel *pOVar2;
  ON_SubDEdgeIdIterator eidit;
  ON_SubDEdgeIdIterator local_40;
  
  ON_SubDEdgeIdIterator::ON_SubDEdgeIdIterator(&local_40,this);
  peVar1 = (this->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if ((peVar1 == (element_type *)0x0) ||
     (pOVar2 = peVar1->m_active_level, pOVar2 == (ON_SubDLevel *)0x0)) {
    pOVar2 = &ON_SubDLevel::Empty;
  }
  Internal_EdgeHash(__return_storage_ptr__,hash_type,pOVar2->m_edge[0],pOVar2->m_level_index,
                    &local_40);
  ON_SubDRef::~ON_SubDRef(&local_40.m_subd_ref);
  return __return_storage_ptr__;
}

Assistant:

const ON_SHA1_Hash ON_SubD::EdgeHash(ON_SubDHashType hash_type) const
{
  ON_SubDEdgeIdIterator eidit(*this);
  return Internal_EdgeHash(hash_type,FirstEdge(), this->ActiveLevelIndex(), eidit);
}